

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::getRules
          (RuleBasedCollator *this,UColRuleOption delta,UnicodeString *buffer)

{
  UnicodeString *this_00;
  undefined4 in_register_00000034;
  UnicodeString *buffer_local;
  UColRuleOption delta_local;
  RuleBasedCollator *this_local;
  
  if (delta == UCOL_TAILORING_ONLY) {
    UnicodeString::operator=(buffer,&this->tailoring->rules);
  }
  else {
    UnicodeString::remove(buffer,(char *)CONCAT44(in_register_00000034,delta));
    CollationLoader::appendRootRules(buffer);
    this_00 = UnicodeString::append(buffer,&this->tailoring->rules);
    UnicodeString::getTerminatedBuffer(this_00);
  }
  return;
}

Assistant:

void
RuleBasedCollator::getRules(UColRuleOption delta, UnicodeString &buffer) const {
    if(delta == UCOL_TAILORING_ONLY) {
        buffer = tailoring->rules;
        return;
    }
    // UCOL_FULL_RULES
    buffer.remove();
    CollationLoader::appendRootRules(buffer);
    buffer.append(tailoring->rules).getTerminatedBuffer();
}